

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O0

char * __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetValue
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char *a_pSection,
          char *a_pKey,char *a_pDefault,bool *a_pHasMultiple)

{
  bool bVar1;
  pointer ppVar2;
  _Self *__x;
  pointer ppVar3;
  _Self local_98;
  _Rb_tree_const_iterator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>
  local_90;
  const_iterator iTemp;
  Entry local_80;
  _Self local_68;
  const_iterator iKeyVal;
  Entry local_58;
  _Self local_40;
  const_iterator iSection;
  bool *a_pHasMultiple_local;
  char *a_pDefault_local;
  char *a_pKey_local;
  char *a_pSection_local;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this_local;
  
  if (a_pHasMultiple != (bool *)0x0) {
    *a_pHasMultiple = false;
  }
  this_local = (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)a_pDefault;
  if ((a_pSection != (char *)0x0) && (a_pKey != (char *)0x0)) {
    iSection._M_node = (_Base_ptr)a_pHasMultiple;
    Entry::Entry(&local_58,a_pSection,0);
    local_40._M_node =
         (_Base_ptr)
         std::
         map<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>_>
         ::find(&this->m_data,&local_58);
    iKeyVal._M_node =
         (_Base_ptr)
         std::
         map<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>_>
         ::end(&this->m_data);
    bVar1 = std::operator==(&local_40,(_Self *)&iKeyVal);
    if (!bVar1) {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>
               ::operator->(&local_40);
      Entry::Entry(&local_80,a_pKey,0);
      local_68._M_node =
           (_Base_ptr)
           std::
           multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
           ::find(&ppVar2->second,&local_80);
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>
               ::operator->(&local_40);
      iTemp = std::
              multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
              ::end(&ppVar2->second);
      bVar1 = std::operator==(&local_68,&iTemp);
      if (!bVar1) {
        if (((this->m_bAllowMultiKey & 1U) != 0) && (iSection._M_node != (_Base_ptr)0x0)) {
          local_90._M_node = local_68._M_node;
          __x = std::
                _Rb_tree_const_iterator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>
                ::operator++(&local_90);
          ppVar2 = std::
                   _Rb_tree_const_iterator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>
                   ::operator->(&local_40);
          local_98._M_node =
               (_Base_ptr)
               std::
               multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
               ::end(&ppVar2->second);
          bVar1 = std::operator!=(__x,&local_98);
          if (bVar1) {
            ppVar3 = std::
                     _Rb_tree_const_iterator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>
                     ::operator->(&local_90);
            bVar1 = IsLess(this,a_pKey,(ppVar3->first).pItem);
            if (!bVar1) {
              *(undefined1 *)&(iSection._M_node)->_M_color = _S_black;
            }
          }
        }
        ppVar3 = std::
                 _Rb_tree_const_iterator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>
                 ::operator->(&local_68);
        this_local = (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)
                     ppVar3->second;
      }
    }
  }
  return (char *)this_local;
}

Assistant:

const SI_CHAR *CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::GetValue(const SI_CHAR *a_pSection,
																			const SI_CHAR *a_pKey,
																			const SI_CHAR *a_pDefault,
																			bool *a_pHasMultiple) const {
	if (a_pHasMultiple) {
		*a_pHasMultiple = false;
	}
	if (!a_pSection || !a_pKey) {
		return a_pDefault;
	}
	typename TSection::const_iterator iSection = m_data.find(a_pSection);
	if (iSection == m_data.end()) {
		return a_pDefault;
	}
	typename TKeyVal::const_iterator iKeyVal = iSection->second.find(a_pKey);
	if (iKeyVal == iSection->second.end()) {
		return a_pDefault;
	}

	// check for multiple entries with the same key
	if (m_bAllowMultiKey && a_pHasMultiple) {
		typename TKeyVal::const_iterator iTemp = iKeyVal;
		if (++iTemp != iSection->second.end()) {
			if (!IsLess(a_pKey, iTemp->first.pItem)) {
				*a_pHasMultiple = true;
			}
		}
	}

	return iKeyVal->second;
}